

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv32_impl.h
# Opt level: O2

void secp256k1_modinv32_var(secp256k1_modinv32_signed30 *x,secp256k1_modinv32_modinfo *modinfo)

{
  int iVar1;
  long lVar2;
  byte bVar3;
  uint uVar4;
  int i;
  int iVar5;
  int iVar6;
  long lVar7;
  int len;
  uint uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  secp256k1_modinv32_trans2x2 t;
  int32_t iStack_dc;
  secp256k1_modinv32_signed30 g;
  int32_t iStack_ac;
  secp256k1_modinv32_signed30 f;
  secp256k1_modinv32_signed30 d;
  secp256k1_modinv32_signed30 local_54;
  
  d.v[8] = 0;
  d.v[4] = 0;
  d.v[5] = 0;
  d.v[6] = 0;
  d.v[7] = 0;
  d.v[0] = 0;
  d.v[1] = 0;
  d.v[2] = 0;
  d.v[3] = 0;
  local_54.v[5] = 0;
  local_54.v[6] = 0;
  local_54.v[7] = 0;
  local_54.v[8] = 0;
  local_54.v[1] = 0;
  local_54.v[2] = 0;
  local_54.v[3] = 0;
  local_54.v[4] = 0;
  local_54.v[0] = 1;
  f.v[8] = (modinfo->modulus).v[8];
  f.v._0_8_ = *(undefined8 *)(modinfo->modulus).v;
  f.v._8_8_ = *(undefined8 *)((modinfo->modulus).v + 2);
  f.v._16_8_ = *(undefined8 *)((modinfo->modulus).v + 4);
  f.v._24_8_ = *(undefined8 *)((modinfo->modulus).v + 6);
  g.v[8] = x->v[8];
  g.v._0_8_ = *(undefined8 *)x->v;
  g.v._8_8_ = *(undefined8 *)(x->v + 2);
  g.v._16_8_ = *(undefined8 *)(x->v + 4);
  g.v._24_8_ = *(undefined8 *)(x->v + 6);
  len = 9;
  iVar11 = -1;
  do {
    t.q = 0;
    t.u = 1;
    t.r = 1;
    iVar5 = 0x1e;
    t.v = 0;
    uVar4 = f.v[0];
    uVar8 = g.v[0];
    while( true ) {
      uVar9 = -1 << ((byte)iVar5 & 0x1f) | uVar8;
      iVar10 = 0;
      if (uVar9 != 0) {
        for (; (uVar9 >> iVar10 & 1) == 0; iVar10 = iVar10 + 1) {
        }
      }
      bVar3 = (byte)iVar10;
      uVar8 = uVar8 >> (bVar3 & 0x1f);
      t.u = t.u << (bVar3 & 0x1f);
      t.v = t.v << (bVar3 & 0x1f);
      iVar11 = iVar11 - iVar10;
      iVar5 = iVar5 - iVar10;
      if (iVar5 == 0) break;
      iVar10 = t.q;
      iVar6 = t.r;
      if (iVar11 < 0) {
        iVar11 = -iVar11;
        uVar9 = -uVar4;
        uVar4 = uVar8;
        uVar8 = uVar9;
        iVar10 = -t.u;
        iVar6 = -t.v;
        t.u = t.q;
        t.v = t.r;
      }
      iVar1 = iVar11 + 1;
      if (iVar5 <= iVar11 + 1) {
        iVar1 = iVar5;
      }
      uVar9 = ((uint)(byte)(secp256k1_modinv32_inv256[uVar4 >> 1 & 0x7f] * (char)uVar8) <<
              (-(char)iVar1 & 0x1fU)) >> (-(char)iVar1 & 0x1fU);
      uVar8 = uVar8 + uVar9 * uVar4;
      t.q = uVar9 * t.u + iVar10;
      t.r = uVar9 * t.v + iVar6;
    }
    secp256k1_modinv32_update_de_30(&d,&local_54,&t,modinfo);
    secp256k1_modinv32_update_fg_30_var(len,&f,&g,&t);
    lVar2 = (long)len;
    if (g.v[0] == 0) {
      uVar4 = 0;
      for (lVar7 = 1; lVar7 < lVar2; lVar7 = lVar7 + 1) {
        uVar4 = uVar4 | g.v[lVar7];
      }
      if (uVar4 == 0) {
        secp256k1_modinv32_normalize_30(&d,f.v[lVar2 + -1],modinfo);
        x->v[8] = d.v[8];
        *(undefined8 *)(x->v + 4) = d.v._16_8_;
        *(undefined8 *)(x->v + 6) = d.v._24_8_;
        *(undefined8 *)x->v = d.v._0_8_;
        *(undefined8 *)(x->v + 2) = d.v._8_8_;
        return;
      }
    }
    iVar5 = f.v[lVar2 + -1];
    iVar10 = g.v[lVar2 + -1];
    iVar6 = len + -2;
    if (iVar10 >> 0x1f == iVar10 && (iVar5 >> 0x1f == iVar5 && -1 < iVar6)) {
      len = len + -1;
      f.v[iVar6] = f.v[iVar6] | iVar5 << 0x1e;
      g.v[iVar6] = g.v[iVar6] | iVar10 << 0x1e;
    }
  } while( true );
}

Assistant:

static void secp256k1_modinv32_var(secp256k1_modinv32_signed30 *x, const secp256k1_modinv32_modinfo *modinfo) {
    /* Start with d=0, e=1, f=modulus, g=x, eta=-1. */
    secp256k1_modinv32_signed30 d = {{0, 0, 0, 0, 0, 0, 0, 0, 0}};
    secp256k1_modinv32_signed30 e = {{1, 0, 0, 0, 0, 0, 0, 0, 0}};
    secp256k1_modinv32_signed30 f = modinfo->modulus;
    secp256k1_modinv32_signed30 g = *x;
#ifdef VERIFY
    int i = 0;
#endif
    int j, len = 9;
    int32_t eta = -1; /* eta = -delta; delta is initially 1 (faster for the variable-time code) */
    int32_t cond, fn, gn;

    /* Do iterations of 30 divsteps each until g=0. */
    while (1) {
        /* Compute transition matrix and new eta after 30 divsteps. */
        secp256k1_modinv32_trans2x2 t;
        eta = secp256k1_modinv32_divsteps_30_var(eta, f.v[0], g.v[0], &t);
        /* Update d,e using that transition matrix. */
        secp256k1_modinv32_update_de_30(&d, &e, &t, modinfo);
        /* Update f,g using that transition matrix. */

        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, len, &modinfo->modulus, -1) > 0); /* f > -modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, len, &modinfo->modulus, 1) <= 0); /* f <= modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, len, &modinfo->modulus, -1) > 0); /* g > -modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, len, &modinfo->modulus, 1) < 0);  /* g <  modulus */

        secp256k1_modinv32_update_fg_30_var(len, &f, &g, &t);
        /* If the bottom limb of g is 0, there is a chance g=0. */
        if (g.v[0] == 0) {
            cond = 0;
            /* Check if all other limbs are also 0. */
            for (j = 1; j < len; ++j) {
                cond |= g.v[j];
            }
            /* If so, we're done. */
            if (cond == 0) break;
        }

        /* Determine if len>1 and limb (len-1) of both f and g is 0 or -1. */
        fn = f.v[len - 1];
        gn = g.v[len - 1];
        cond = ((int32_t)len - 2) >> 31;
        cond |= fn ^ (fn >> 31);
        cond |= gn ^ (gn >> 31);
        /* If so, reduce length, propagating the sign of f and g's top limb into the one below. */
        if (cond == 0) {
            f.v[len - 2] |= (uint32_t)fn << 30;
            g.v[len - 2] |= (uint32_t)gn << 30;
            --len;
        }

        VERIFY_CHECK(++i < 25); /* We should never need more than 25*30 = 750 divsteps */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, len, &modinfo->modulus, -1) > 0); /* f > -modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, len, &modinfo->modulus, 1) <= 0); /* f <= modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, len, &modinfo->modulus, -1) > 0); /* g > -modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, len, &modinfo->modulus, 1) < 0);  /* g <  modulus */
    }

    /* At this point g is 0 and (if g was not originally 0) f must now equal +/- GCD of
     * the initial f, g values i.e. +/- 1, and d now contains +/- the modular inverse. */

    /* g == 0 */
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, len, &SECP256K1_SIGNED30_ONE, 0) == 0);
    /* |f| == 1, or (x == 0 and d == 0 and f == modulus) */
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, len, &SECP256K1_SIGNED30_ONE, -1) == 0 ||
                 secp256k1_modinv32_mul_cmp_30(&f, len, &SECP256K1_SIGNED30_ONE, 1) == 0 ||
                 (secp256k1_modinv32_mul_cmp_30(x, 9, &SECP256K1_SIGNED30_ONE, 0) == 0 &&
                  secp256k1_modinv32_mul_cmp_30(&d, 9, &SECP256K1_SIGNED30_ONE, 0) == 0 &&
                  secp256k1_modinv32_mul_cmp_30(&f, len, &modinfo->modulus, 1) == 0));

    /* Optionally negate d, normalize to [0,modulus), and return it. */
    secp256k1_modinv32_normalize_30(&d, f.v[len - 1], modinfo);
    *x = d;
}